

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSSLEDDSA.cpp
# Opt level: O2

bool __thiscall
OSSLEDDSA::reconstructParameters
          (OSSLEDDSA *this,AsymmetricParameters **ppParams,ByteString *serialisedData)

{
  int iVar1;
  size_t sVar2;
  ECParameters *this_00;
  
  if ((ppParams != (AsymmetricParameters **)0x0) &&
     (sVar2 = ByteString::size(serialisedData), sVar2 != 0)) {
    this_00 = (ECParameters *)operator_new(0x30);
    (this_00->super_AsymmetricParameters).super_Serialisable._vptr_Serialisable = (_func_int **)0x0;
    (this_00->ec)._vptr_ByteString = (_func_int **)0x0;
    (this_00->ec).byteString.super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>.
    _M_impl.super__Tp_alloc_type._vptr_SecureAllocator = (_func_int **)0x0;
    (this_00->ec).byteString.super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (this_00->ec).byteString.super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (this_00->ec).byteString.super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ECParameters::ECParameters(this_00);
    iVar1 = (*(this_00->super_AsymmetricParameters).super_Serialisable._vptr_Serialisable[4])
                      (this_00,serialisedData);
    if ((char)iVar1 != '\0') {
      *ppParams = (AsymmetricParameters *)this_00;
      return true;
    }
    (*(this_00->super_AsymmetricParameters).super_Serialisable._vptr_Serialisable[2])(this_00);
  }
  return false;
}

Assistant:

bool OSSLEDDSA::reconstructParameters(AsymmetricParameters** ppParams, ByteString& serialisedData)
{
	// Check input parameters
	if ((ppParams == NULL) || (serialisedData.size() == 0))
	{
		return false;
	}

	ECParameters* params = new ECParameters();

	if (!params->deserialise(serialisedData))
	{
		delete params;

		return false;
	}

	*ppParams = params;

	return true;
}